

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3DecOrHexToI64(char *z,i64 *pOut)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((*z == '0') && ((byte)(z[1] | 0x20U) == 0x78)) {
    uVar4 = 1;
    do {
      lVar1 = uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while (z[lVar1] == '0');
    iVar3 = (int)uVar4;
    uVar8 = (ulong)(byte)z[uVar4 & 0xffffffff];
    if ((""[uVar8] & 8) == 0) {
      uVar7 = 0;
      uVar4 = uVar4 & 0xffffffff;
      iVar6 = iVar3;
    }
    else {
      uVar7 = 0;
      do {
        uVar7 = (ulong)(((char)((char)uVar8 * '\x02') >> 7 & 9U) + (char)uVar8 & 0xf) | uVar7 << 4;
        uVar8 = (ulong)(byte)z[uVar4 + 1];
        uVar4 = uVar4 + 1;
      } while ((""[uVar8] & 8) != 0);
      iVar6 = (int)uVar4;
    }
    *pOut = uVar7;
    uVar2 = 2;
    if (iVar6 - iVar3 < 0x11) {
      uVar2 = (uint)(z[uVar4] != '\0');
    }
    return uVar2;
  }
  sVar5 = strspn(z,"+- \n\t0123456789");
  uVar2 = (uint)sVar5 & 0x3fffffff;
  iVar3 = sqlite3Atoi64(z,pOut,(uVar2 + 1) - (uint)(z[uVar2] == '\0'),'\x01');
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3DecOrHexToI64(const char *z, i64 *pOut){
#ifndef SQLITE_OMIT_HEX_INTEGER
  if( z[0]=='0'
   && (z[1]=='x' || z[1]=='X')
  ){
    u64 u = 0;
    int i, k;
    for(i=2; z[i]=='0'; i++){}
    for(k=i; sqlite3Isxdigit(z[k]); k++){
      u = u*16 + sqlite3HexToInt(z[k]);
    }
    memcpy(pOut, &u, 8);
    if( k-i>16 ) return 2;
    if( z[k]!=0 ) return 1;
    return 0;
  }else
#endif /* SQLITE_OMIT_HEX_INTEGER */
  {
    int n = (int)(0x3fffffff&strspn(z,"+- \n\t0123456789"));
    if( z[n] ) n++;
    return sqlite3Atoi64(z, pOut, n, SQLITE_UTF8);
  }
}